

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::deinit(BindingRenderCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_vao != 0) {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void BindingRenderCase::deinit (void)
{
	if (m_vao)
	{
		m_context.getRenderContext().getFunctions().deleteVertexArrays(1, &m_vao);
		m_vao = 0;
	}

	delete m_program;
	m_program = DE_NULL;
}